

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O2

uint Aig_CutTruthPhase(Aig_Cut_t *pCut,Aig_Cut_t *pCut1)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  
  bVar3 = pCut->nFanins;
  uVar5 = 0;
  if ((char)bVar3 < '\x01') {
    bVar3 = 0;
  }
  uVar4 = 0;
  iVar6 = 0;
  while ((bVar3 != uVar5 && (iVar6 != pCut1->nFanins))) {
    iVar1 = *(int *)((long)&pCut1[1].pNext + (long)iVar6 * 4);
    iVar2 = *(int *)((long)&pCut[1].pNext + uVar5 * 4);
    if (iVar1 <= iVar2) {
      if (iVar2 != iVar1) {
        __assert_fail("pCut->pFanins[i] == pCut1->pFanins[k]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigCuts.c"
                      ,0x102,"unsigned int Aig_CutTruthPhase(Aig_Cut_t *, Aig_Cut_t *)");
      }
      uVar4 = uVar4 | 1 << ((uint)uVar5 & 0x1f);
      iVar6 = iVar6 + 1;
    }
    uVar5 = uVar5 + 1;
  }
  return uVar4;
}

Assistant:

static inline unsigned Aig_CutTruthPhase( Aig_Cut_t * pCut, Aig_Cut_t * pCut1 )
{
    unsigned uPhase = 0;
    int i, k;
    for ( i = k = 0; i < pCut->nFanins; i++ )
    {
        if ( k == pCut1->nFanins )
            break;
        if ( pCut->pFanins[i] < pCut1->pFanins[k] )
            continue;
        assert( pCut->pFanins[i] == pCut1->pFanins[k] );
        uPhase |= (1 << i);
        k++;
    }
    return uPhase;
}